

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O1

void ShiftRows(AES_state *s)

{
  undefined1 auVar1 [16];
  long lVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ushort uVar4;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  auVar1 = *(undefined1 (*) [16])s->slice;
  auVar14 = psllw(auVar1,3);
  uVar4 = auVar1._0_2_;
  auVar5._0_2_ = uVar4 >> 1;
  uVar7 = auVar1._2_2_;
  auVar5._2_2_ = uVar7 >> 1;
  uVar8 = auVar1._4_2_;
  auVar5._4_2_ = uVar8 >> 1;
  uVar9 = auVar1._6_2_;
  auVar5._6_2_ = uVar9 >> 1;
  uVar10 = auVar1._8_2_;
  auVar5._8_2_ = uVar10 >> 1;
  uVar11 = auVar1._10_2_;
  auVar5._10_2_ = uVar11 >> 1;
  uVar12 = auVar1._12_2_;
  uVar13 = auVar1._14_2_;
  auVar5._12_2_ = uVar12 >> 1;
  auVar5._14_2_ = uVar13 >> 1;
  auVar16 = psllw(auVar1,2);
  auVar6._0_2_ = uVar4 >> 2;
  auVar6._2_2_ = uVar7 >> 2;
  auVar6._4_2_ = uVar8 >> 2;
  auVar6._6_2_ = uVar9 >> 2;
  auVar6._8_2_ = uVar10 >> 2;
  auVar6._10_2_ = uVar11 >> 2;
  auVar6._12_2_ = uVar12 >> 2;
  auVar6._14_2_ = uVar13 >> 2;
  auVar15._2_2_ = uVar7 * 2;
  auVar15._0_2_ = uVar4 * 2;
  auVar15._4_2_ = uVar8 * 2;
  auVar15._6_2_ = uVar9 * 2;
  auVar15._8_2_ = uVar10 * 2;
  auVar15._10_2_ = uVar11 * 2;
  auVar15._12_2_ = uVar12 * 2;
  auVar15._14_2_ = uVar13 * 2;
  auVar3._0_2_ = uVar4 >> 3;
  auVar3._2_2_ = uVar7 >> 3;
  auVar3._4_2_ = uVar8 >> 3;
  auVar3._6_2_ = uVar9 >> 3;
  auVar3._8_2_ = uVar10 >> 3;
  auVar3._10_2_ = uVar11 >> 3;
  auVar3._12_2_ = uVar12 >> 3;
  auVar3._14_2_ = uVar13 >> 3;
  *(undefined1 (*) [16])s->slice =
       auVar3 & _DAT_004f1c70 | auVar15 & _DAT_004f1c60 | auVar6 & _DAT_004f1c50 |
       auVar16 & _DAT_004f1c40 | auVar5 & _DAT_004f1c30 |
       auVar14 & _DAT_004f1c20 | _DAT_004f1c10 & auVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ShiftRows(AES_state* s) {
    int i;
    for (i = 0; i < 8; i++) {
        uint16_t v = s->slice[i];
        s->slice[i] =
            (v & BIT_RANGE(0, 4)) |
            BIT_RANGE_LEFT(v, 4, 5, 3) | BIT_RANGE_RIGHT(v, 5, 8, 1) |
            BIT_RANGE_LEFT(v, 8, 10, 2) | BIT_RANGE_RIGHT(v, 10, 12, 2) |
            BIT_RANGE_LEFT(v, 12, 15, 1) | BIT_RANGE_RIGHT(v, 15, 16, 3);
    }
}